

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void server_communicate(int *file_descriptors,Arguments *args)

{
  FILE *__s;
  void *__ptr;
  size_t sVar1;
  int *in_RSI;
  long in_RDI;
  int message;
  void *buffer;
  FILE *stream;
  Benchmarks bench;
  sigaction signal_action;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar2;
  undefined8 in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  Arguments *in_stack_ffffffffffffff68;
  Benchmarks *in_stack_ffffffffffffff70;
  
  __s = (FILE *)open_stream(in_stack_ffffffffffffff20,
                            (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  setup_server_signals((sigaction *)0x1024a8);
  __ptr = malloc((long)*in_RSI);
  setup_benchmarks((Benchmarks *)0x1024c7);
  wait_for_signal((sigaction *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  iVar2 = 0;
  while( true ) {
    if (in_RSI[1] <= iVar2) {
      evaluate(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      close(*(int *)(in_RDI + 4));
      free(__ptr);
      return;
    }
    now();
    sVar1 = fwrite(__ptr,(long)*in_RSI,1,__s);
    if (sVar1 == 0xffffffffffffffff) break;
    fflush(__s);
    notify_client();
    wait_for_signal((sigaction *)CONCAT44(iVar2,in_stack_ffffffffffffff10));
    benchmark((Benchmarks *)CONCAT44(iVar2,in_stack_ffffffffffffff10));
    iVar2 = iVar2 + 1;
  }
  throw((char *)0x102527);
}

Assistant:

void server_communicate(int file_descriptors[2], struct Arguments *args) {
	struct sigaction signal_action;
	struct Benchmarks bench;
	FILE *stream;
	void *buffer;
	int message;

	stream = open_stream(file_descriptors, 1);
	setup_server_signals(&signal_action);
	buffer = malloc(args->size);
	setup_benchmarks(&bench);

	wait_for_signal(&signal_action);

	for (message = 0; message < args->count; ++message) {
		bench.single_start = now();

		if (fwrite(buffer, args->size, 1, stream) == -1) {
			throw("Error writing to pipe");
		}
		// Send immediately
		fflush(stream);

		notify_client();
		wait_for_signal(&signal_action);
		benchmark(&bench);
	}

	evaluate(&bench, args);

	// Now close the write end too
	close(file_descriptors[1]);
	free(buffer);
}